

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O1

void Llb_ManGroupCreate_rec(Aig_Man_t *pAig,Aig_Obj_t *pObj,Vec_Ptr_t *vSupp)

{
  uint uVar1;
  void **ppvVar2;
  int iVar3;
  
  while( true ) {
    if (pObj->TravId == pAig->nTravIds) {
      return;
    }
    pObj->TravId = pAig->nTravIds;
    if (((ulong)pObj & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                    ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
    }
    uVar1 = (uint)*(ulong *)&pObj->field_0x18 & 7;
    if (uVar1 == 1) {
      return;
    }
    if ((*(ulong *)&pObj->field_0x18 & 0x10) != 0) break;
    if (uVar1 != 5) {
      __assert_fail("Aig_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Group.c"
                    ,0x9f,"void Llb_ManGroupCreate_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
    Llb_ManGroupCreate_rec(pAig,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vSupp);
    pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
  }
  uVar1 = vSupp->nCap;
  if (vSupp->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vSupp->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc(0x80);
      }
      else {
        ppvVar2 = (void **)realloc(vSupp->pArray,0x80);
      }
      vSupp->pArray = ppvVar2;
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar1 * 2;
      if (iVar3 <= (int)uVar1) goto LAB_00923e69;
      if (vSupp->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar2 = (void **)realloc(vSupp->pArray,(ulong)uVar1 << 4);
      }
      vSupp->pArray = ppvVar2;
    }
    vSupp->nCap = iVar3;
  }
LAB_00923e69:
  iVar3 = vSupp->nSize;
  vSupp->nSize = iVar3 + 1;
  vSupp->pArray[iVar3] = pObj;
  return;
}

Assistant:

void Llb_ManGroupCreate_rec( Aig_Man_t * pAig, Aig_Obj_t * pObj, Vec_Ptr_t * vSupp )
{ 
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pAig, pObj);
    if ( Aig_ObjIsConst1(pObj) )
        return;
    if ( pObj->fMarkA )
    {
        Vec_PtrPush( vSupp, pObj );
        return;
    }
    assert( Aig_ObjIsAnd(pObj) );
    Llb_ManGroupCreate_rec( pAig, Aig_ObjFanin0(pObj), vSupp );
    Llb_ManGroupCreate_rec( pAig, Aig_ObjFanin1(pObj), vSupp );
}